

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::end
          (iterator *__return_storage_ptr__,IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->valid = false;
    return __return_storage_ptr__;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded == '\0';
    (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (bVar2) {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_0011ae12;
    }
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_0011ae12:
  __return_storage_ptr__->valid = false;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }